

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qflatmap_p.h
# Opt level: O3

pair<QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>::iterator,_bool>
* __thiscall
QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
::try_emplace<QDBusListener::ChangeSignal>
          (pair<QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>::iterator,_bool>
           *__return_storage_ptr__,
          QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
          *this,DBusKey *key,ChangeSignal *args)

{
  mapped_container_type *this_00;
  DBusKey *pDVar1;
  bool bVar2;
  const_iterator cVar3;
  pointer pDVar4;
  iterator iVar5;
  iterator iVar6;
  iterator iVar7;
  long lVar8;
  size_type sVar9;
  
  pDVar1 = (this->c).keys.d.ptr;
  cVar3 = std::
          __lower_bound<QList<QDBusListener::DBusKey>::const_iterator,QDBusListener::DBusKey,__gnu_cxx::__ops::_Iter_comp_val<std::less<QDBusListener::DBusKey>>>
                    (pDVar1,pDVar1 + (this->c).keys.d.size);
  lVar8 = (long)cVar3.i - (long)(this->c).keys.d.ptr;
  sVar9 = (lVar8 >> 4) * -0x5555555555555555;
  if (sVar9 - (this->c).keys.d.size != 0) {
    pDVar4 = QList<QDBusListener::DBusKey>::data((QList<QDBusListener::DBusKey> *)this);
    bVar2 = QDBusListener::DBusKey::operator<(key,(DBusKey *)((long)pDVar4 + lVar8));
    if (!bVar2) {
      bVar2 = false;
      goto LAB_00646bee;
    }
  }
  this_00 = &(this->c).values;
  iVar5 = QList<QDBusListener::ChangeSignal>::begin(this_00);
  QtPrivate::QMovableArrayOps<QDBusListener::ChangeSignal>::emplace<QDBusListener::ChangeSignal>
            ((QMovableArrayOps<QDBusListener::ChangeSignal> *)this_00,
             (long)iVar5.i + ((lVar8 >> 4) * 0x5555555555555558 - (long)(this->c).values.d.ptr) >> 3
             ,args);
  QList<QDBusListener::ChangeSignal>::begin(this_00);
  iVar6 = QList<QDBusListener::DBusKey>::begin((QList<QDBusListener::DBusKey> *)this);
  lVar8 = (long)iVar6.i + (lVar8 - (long)(this->c).keys.d.ptr);
  QtPrivate::QGenericArrayOps<QDBusListener::DBusKey>::insert
            ((QGenericArrayOps<QDBusListener::DBusKey> *)this,(lVar8 >> 4) * -0x5555555555555555,1,
             key);
  iVar6 = QList<QDBusListener::DBusKey>::begin((QList<QDBusListener::DBusKey> *)this);
  iVar7 = QList<QDBusListener::DBusKey>::begin((QList<QDBusListener::DBusKey> *)this);
  sVar9 = ((long)iVar6.i + (lVar8 - (long)iVar7.i) >> 4) * -0x5555555555555555;
  bVar2 = true;
LAB_00646bee:
  (__return_storage_ptr__->first).c = &this->c;
  (__return_storage_ptr__->first).i = sVar9;
  __return_storage_ptr__->second = bVar2;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> try_emplace(const Key &key, Args&&...args)
    {
        auto it = lower_bound(key);
        if (it == end() || key_compare::operator()(key, it.key())) {
            c.values.emplace(toValuesIterator(it), std::forward<Args>(args)...);
            return { fromKeysIterator(c.keys.insert(toKeysIterator(it), key)), true };
        } else {
            return {it, false};
        }
    }